

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_cv_alloc(nng_cv **cvp,nng_mtx *mx)

{
  nni_cv *cv_00;
  nng_cv *cv;
  nng_mtx *mx_local;
  nng_cv **cvp_local;
  
  cv_00 = (nni_cv *)nni_zalloc(0x38);
  if (cv_00 == (nni_cv *)0x0) {
    cvp_local._4_4_ = 2;
  }
  else {
    nni_cv_init(cv_00,&mx->m);
    *cvp = (nng_cv *)cv_00;
    cvp_local._4_4_ = 0;
  }
  return cvp_local._4_4_;
}

Assistant:

int
nng_cv_alloc(nng_cv **cvp, nng_mtx *mx)
{
	nng_cv *cv;

	if ((cv = NNI_ALLOC_STRUCT(cv)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_cv_init(&cv->c, &mx->m);
	*cvp = cv;
	return (0);
}